

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O1

int Csw_CutSupportMinimize(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  char cVar1;
  uint Phase;
  int iVar2;
  long lVar3;
  uint uVar4;
  int nVars;
  long lVar5;
  uint *pTruth;
  
  pTruth = (uint *)((long)&pCut[1].pNext + (long)pCut->nLeafMax * 4);
  Phase = Kit_TruthSupport(pTruth,p->nLeafMax);
  uVar4 = (Phase >> 1 & 0x55555555) + (Phase & 0x55555555);
  uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
  uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
  uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
  nVars = (uVar4 >> 0x10) + (uVar4 & 0xffff);
  if (nVars != pCut->nFanins) {
    if (pCut->nFanins <= nVars) {
      __assert_fail("nFansNew < pCut->nFanins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                    ,0xc1,"int Csw_CutSupportMinimize(Csw_Man_t *, Csw_Cut_t *)");
    }
    Kit_TruthShrink(p->puTemp[0],pTruth,nVars,p->nLeafMax,Phase,1);
    cVar1 = pCut->nFanins;
    if ((long)cVar1 < 1) {
      iVar2 = 0;
    }
    else {
      lVar3 = 0;
      iVar2 = 0;
      do {
        if ((Phase >> ((uint)lVar3 & 0x1f) & 1) != 0) {
          lVar5 = (long)iVar2;
          iVar2 = iVar2 + 1;
          *(undefined4 *)((long)&pCut[1].pNext + lVar5 * 4) =
               *(undefined4 *)((long)&pCut[1].pNext + lVar3 * 4);
        }
        lVar3 = lVar3 + 1;
      } while (cVar1 != lVar3);
    }
    if (iVar2 != nVars) {
      __assert_fail("k == nFansNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                    ,199,"int Csw_CutSupportMinimize(Csw_Man_t *, Csw_Cut_t *)");
    }
    pCut->nFanins = (char)nVars;
  }
  return nVars;
}

Assistant:

int Csw_CutSupportMinimize( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    unsigned * pTruth;
    int uSupp, nFansNew, i, k;
    // get truth table
    pTruth = Csw_CutTruth( pCut );
    // get support 
    uSupp = Kit_TruthSupport( pTruth, p->nLeafMax );
    // get the new support size
    nFansNew = Kit_WordCountOnes( uSupp );
    // check if there are redundant variables
    if ( nFansNew == pCut->nFanins )
        return nFansNew;
    assert( nFansNew < pCut->nFanins );
    // minimize support
    Kit_TruthShrink( p->puTemp[0], pTruth, nFansNew, p->nLeafMax, uSupp, 1 );
    for ( i = k = 0; i < pCut->nFanins; i++ )
        if ( uSupp & (1 << i) )
            pCut->pFanins[k++] = pCut->pFanins[i];
    assert( k == nFansNew );
    pCut->nFanins = nFansNew;
//    assert( nFansNew == Kit_TruthSupportSize( pTruth, p->nLeafMax ) );
//Extra_PrintBinary( stdout, pTruth, (1<<p->nLeafMax) ); printf( "\n" );
    return nFansNew;
}